

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void ScanFile(ConfigScanner *sc)

{
  char cVar1;
  ValueType VVar2;
  char *pcVar3;
  SectionList *pSVar4;
  ConfigItem *pCVar5;
  SectionList *pSVar6;
  ItemValue IVar7;
  ConfigItem *pCVar8;
  
  if (g_verbose) {
    ScanFile_cold_1();
  }
  if (sc != (ConfigScanner *)0x0) {
    pcVar3 = sc->base;
    sc->ptr = pcVar3;
    sc->current_section_name = (char *)0x0;
    if (*pcVar3 != '\0') {
      do {
        sc->vtype = VTYPE_NONE;
        sc->current_key = (char *)0x0;
        while( true ) {
          if ((*pcVar3 != ' ') && (*pcVar3 != '\t')) break;
          sc->ptr = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
        }
        if (*sc->ptr == '[') {
          pcVar3 = ScanSection(sc);
          if (pcVar3 != (char *)0x0) {
            if (g_verbose == true) {
              fprintf(_stderr,anon_var_dwarf_5c9,pcVar3);
            }
            pSVar4 = (SectionList *)malloc(0x10);
            pSVar4->name = pcVar3;
            pSVar4->succ = (SectionList_t *)0x0;
            pSVar6 = (SectionList *)&sc->first_section;
            if (sc->first_section != (SectionList *)0x0) {
              pSVar6 = sc->current_section;
            }
            pSVar6->succ = pSVar4;
            sc->current_section = pSVar4;
          }
        }
        else {
          ScanPair(sc);
        }
        pcVar3 = sc->ptr;
        while( true ) {
          if ((*pcVar3 != ' ') && (*pcVar3 != '\t')) break;
          sc->ptr = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
        }
        if ((*sc->ptr == ';') || (*sc->ptr == '#')) {
          SkipLine(sc);
        }
        else {
          pcVar3 = sc->ptr;
          cVar1 = *pcVar3;
          if (cVar1 != '\0') {
            if (cVar1 == '\r') {
              sc->ptr = pcVar3 + 1;
              if (pcVar3[1] != '\n') goto LAB_00142e62;
              pcVar3 = pcVar3 + 2;
            }
            else {
              if (cVar1 != '\n') {
                return;
              }
              pcVar3 = pcVar3 + 1;
            }
            sc->ptr = pcVar3;
          }
        }
LAB_00142e62:
        pcVar3 = sc->current_key;
        if (pcVar3 == (char *)0x0) goto LAB_00142ef4;
        pCVar5 = (ConfigItem *)malloc(0x28);
        pCVar5->key = pcVar3;
        VVar2 = sc->vtype;
        pCVar5->vtype = VVar2;
        pCVar5->section = sc->current_section;
        pCVar5->succ = (ConfigItem_t *)0x0;
        switch(VVar2) {
        case VTYPE_STRING:
          IVar7 = (ItemValue)sc->current_string;
          goto LAB_00142eca;
        case VTYPE_BOOLEAN:
          (pCVar5->value).v_boolean = sc->current_boolean;
          break;
        case VTYPE_INTEGER:
          IVar7 = (ItemValue)sc->current_integer;
LAB_00142eca:
          pCVar5->value = IVar7;
          break;
        case VTYPE_DOUBLE:
          pCVar5->value = (ItemValue)sc->current_double;
        }
        pCVar8 = sc->current_item;
        if (sc->current_item == (ConfigItem *)0x0) {
          pCVar8 = (ConfigItem *)&sc->first_item;
        }
        pCVar8->succ = pCVar5;
        sc->current_item = pCVar5;
LAB_00142ef4:
        pcVar3 = sc->ptr;
      } while (*pcVar3 != '\0');
    }
  }
  return;
}

Assistant:

void ScanFile(ConfigScanner *sc)
{
	if (g_verbose)
	{
		console_message(u8"設定解析開始\n");
	}

	if (sc == NULL)
	{
		return;
	}
	sc->ptr = sc->base;
	sc->current_section_name = NULL;
	while (*sc->ptr != '\0')
	{
		sc->vtype = VTYPE_NONE;
		sc->current_key = NULL;
		SkipSpace(sc);
		if (isSectionTop(sc))
		{
			char *section = ScanSection(sc);
			if (section)
			{
				if (g_verbose)
				{
					console_message_string(u8"config section： %s\n", section);
				}
				SectionList *sec = (SectionList *)malloc(sizeof(SectionList));
				sec->name = section;
				sec->succ = NULL;
				if (!sc->first_section)
				{
					sc->first_section = sec;
				}
				else
				{
					sc->current_section->succ = sec;
				}
				sc->current_section = sec;
			}
		}
		else
		{
			ScanPair(sc);
		}
		SkipSpace(sc);
		if (isBeginningComment(sc))
		{
			SkipLine(sc);
		}
		else if (!ScanEol(sc))
		{
			break;
		}

		if (sc->current_key != NULL)
		{
			ConfigItem *temp = (ConfigItem *)malloc(sizeof(ConfigItem));
			temp->key = sc->current_key;
			temp->vtype = sc->vtype;
			temp->section = sc->current_section;
			temp->succ = NULL;
			switch (temp->vtype)
			{
			case VTYPE_NONE:
				break;
			case VTYPE_STRING:
				temp->value.v_string = sc->current_string;
				break;
			case VTYPE_BOOLEAN:
				temp->value.v_boolean = sc->current_boolean;
				break;
			case VTYPE_INTEGER:
				temp->value.v_integer = sc->current_integer;
				break;
			case VTYPE_DOUBLE:
				temp->value.v_double = sc->current_double;
				break;
			}

			if (!sc->current_item)
			{
				sc->first_item = temp;
			}
			else
			{
				sc->current_item->succ = temp;
			}
			sc->current_item = temp;
		}
	}
}